

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O2

void Memory::InPlaceFreeListPolicy::MergeDelayFreeList(void *freeList)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  FreeObject *firstFreeObject;
  long lVar5;
  long *__s;
  
  if (freeList != (void *)0x0) {
    lVar1 = 0;
LAB_0021dd24:
    lVar5 = lVar1;
    if (lVar5 != 0x40) {
      lVar1 = lVar5 + 1;
      plVar4 = (long *)0x0;
      __s = *(long **)((long)freeList + lVar5 * 8 + 0x200);
      while (__s != (long *)0x0) {
        plVar2 = (long *)*__s;
        memset(__s,0xfe,lVar1 * 0x10);
        *__s = (long)plVar2;
        plVar4 = __s;
        __s = plVar2;
      }
      lVar3 = *(long *)((long)freeList + lVar5 * 8);
      if (lVar3 != 0) goto code_r0x0021dd6f;
      *(undefined8 *)((long)freeList + lVar5 * 8) =
           *(undefined8 *)((long)freeList + lVar5 * 8 + 0x200);
      goto LAB_0021dd99;
    }
  }
  return;
code_r0x0021dd6f:
  if (plVar4 != (long *)0x0) {
    *(undefined8 *)((long)freeList + lVar5 * 8) =
         *(undefined8 *)((long)freeList + lVar5 * 8 + 0x200);
    *plVar4 = lVar3;
LAB_0021dd99:
    *(undefined8 *)((long)freeList + lVar5 * 8 + 0x200) = 0;
  }
  goto LAB_0021dd24;
}

Assistant:

void InPlaceFreeListPolicy::MergeDelayFreeList(void * freeList)
{
    if (!freeList) return;

    FreeObject ** freeObjectLists = reinterpret_cast<FreeObject **>(freeList);
    FreeObject ** delayFreeObjectLists = freeObjectLists + buckets;

    for (int i = 0; i < buckets; i++)
    {
        int size = (i + 1) << ArenaAllocator::ObjectAlignmentBitShift;
        FreeObject *delayObject = delayFreeObjectLists[i];
        FreeObject *lastDelayObject = nullptr;

        while (delayObject != nullptr)
        {
            FreeObject *nextDelayObject = delayObject->next;
            // DebugPatternFill is required here, because we set isDeleted bit on freed Opnd
            PrepareFreeObject(delayObject, size);
            delayObject->next = nextDelayObject;
            lastDelayObject = delayObject;
            delayObject = nextDelayObject;
        }

        if (freeObjectLists[i] == nullptr)
        {
            freeObjectLists[i] = delayFreeObjectLists[i];
            delayFreeObjectLists[i] = nullptr;
        }
        else if (lastDelayObject != nullptr) {
            FreeObject * firstFreeObject = freeObjectLists[i];
            freeObjectLists[i] = delayFreeObjectLists[i];
            lastDelayObject->next = firstFreeObject;
            delayFreeObjectLists[i] = nullptr;
        }
    }
}